

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *local_10;
  
  local_10 = ObjectKindName::objectKindNames[*(int *)&this->CMakeInstance];
  cmStrCat<char_const*,char_const(&)[3],unsigned_long_const&>
            (__return_storage_ptr__,&local_10,(char (*) [3])"-v",(unsigned_long *)&this->APIv1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = cmStrCat(ObjectKindName(o.Kind), "-v", o.Version);
  return name;
}